

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

bool djgt_to_gl(djg_texture *texture,GLint target,GLint internalformat,bool immutable,bool mipmap,
               GLuint *gl)

{
  PFNGLTEXIMAGE2DPROC p_Var1;
  PFNGLTEXSTORAGE1DPROC p_Var2;
  PFNGLTEXSTORAGE2DPROC p_Var3;
  PFNGLTEXSTORAGE3DPROC p_Var4;
  GLenum GVar5;
  GLenum GVar6;
  bool bVar7;
  GLboolean GVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  byte local_125;
  byte local_115;
  byte local_105;
  int local_9c;
  djg_texture *pdStack_98;
  int i_3;
  djg_texture *it_3;
  int z_1;
  int y_3;
  int x_5;
  int i_2;
  djg_texture *it_2;
  int z;
  int y_2;
  int x_4;
  int i_1;
  djg_texture *it_1;
  int y_1;
  int x_3;
  int y;
  int x_2;
  djg_texture *it;
  int i;
  int x_1;
  int x;
  GLuint glt;
  bool v;
  GLuint *gl_local;
  GLenum local_20;
  bool mipmap_local;
  GLenum GStack_1c;
  bool immutable_local;
  GLint internalformat_local;
  GLint target_local;
  djg_texture *texture_local;
  
  x._3_1_ = 1;
  _glt = gl;
  gl_local._6_1_ = mipmap;
  gl_local._7_1_ = immutable;
  local_20 = internalformat;
  GStack_1c = target;
  _internalformat_local = texture;
  if (texture == (djg_texture *)0x0 || gl == (GLuint *)0x0) {
    __assert_fail("texture && gl",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                  ,0x46f,"bool djgt_to_gl(const djg_texture *, GLint, GLint, bool, bool, GLuint *)")
    ;
  }
  djgt__validate();
  iVar9 = djgt__count(_internalformat_local);
  if (iVar9 == 0) {
    return false;
  }
  (*glad_glGenTextures)(1,(GLuint *)&x_1);
  (*glad_glBindTexture)(GStack_1c,x_1);
  GVar6 = GStack_1c;
  GVar5 = local_20;
  p_Var3 = glad_glTexStorage2D;
  p_Var2 = glad_glTexStorage1D;
  p_Var1 = glad_glTexImage2D;
  if (GStack_1c == 0xde0) {
LAB_00193975:
    iVar9 = _internalformat_local->next->x;
    if ((gl_local._7_1_ & 1) == 0) {
      (*glad_glTexImage1D)(GStack_1c,0,local_20,iVar9,0,0x1903,0x1401,(void *)0x0);
    }
    else {
      iVar10 = djgt__mipcnt(iVar9,0,0);
      (*p_Var2)(GVar6,iVar10,local_20,iVar9);
    }
    djgt__glTexSubImage1D(_internalformat_local->next,GStack_1c,0);
  }
  else {
    if (GStack_1c != 0xde1) {
      if (GStack_1c == 0x8063) goto LAB_00193975;
      if (GStack_1c != 0x8064) {
        if (GStack_1c - 0x806f < 2) {
          iVar9 = _internalformat_local->next->x;
          iVar10 = _internalformat_local->next->y;
          iVar11 = djgt__count(_internalformat_local);
          GVar5 = GStack_1c;
          p_Var4 = glad_glTexStorage3D;
          pdStack_98 = _internalformat_local->next;
          if ((gl_local._7_1_ & 1) == 0) {
            (*glad_glTexImage3D)
                      (GStack_1c,0,local_20,iVar9,iVar10,iVar11,0,0x1903,0x1401,(void *)0x0);
          }
          else {
            iVar12 = djgt__mipcnt(iVar9,iVar10,iVar11);
            (*p_Var4)(GVar5,iVar12,local_20,iVar9,iVar10,iVar11);
          }
          local_9c = 0;
          while( true ) {
            local_125 = 0;
            if (local_9c < iVar11) {
              local_125 = x._3_1_;
            }
            if ((local_125 & 1) == 0) break;
            bVar7 = djgt__glTexSubImage3D(pdStack_98,GStack_1c,0,0,iVar11);
            x._3_1_ = (x._3_1_ & 1 & bVar7) != 0;
            pdStack_98 = pdStack_98->next;
            local_9c = local_9c + 1;
          }
          goto LAB_00194057;
        }
        if ((GStack_1c != 0x84f5) && (GStack_1c != 0x84f7)) {
          if (GStack_1c == 0x8513) {
            iVar9 = _internalformat_local->next->x;
            iVar10 = _internalformat_local->next->y;
            _x_4 = _internalformat_local->next;
            if ((gl_local._7_1_ & 1) == 0) {
              for (y_2 = 0; y_2 < 6; y_2 = y_2 + 1) {
                (*glad_glTexImage2D)
                          (y_2 + 0x8515,0,local_20,iVar9,iVar10,0,0x1903,0x1401,(void *)0x0);
              }
            }
            else {
              iVar11 = djgt__mipcnt(iVar9,iVar10,0);
              (*p_Var3)(0x8513,iVar11,local_20,iVar9,iVar10);
            }
            y_2 = 0;
            while( true ) {
              local_105 = 0;
              if ((y_2 < 6) && (local_105 = 0, _x_4 != (djg_texture *)0x0)) {
                local_105 = x._3_1_;
              }
              if ((local_105 & 1) == 0) break;
              bVar7 = djgt__glTexSubImage2D(_x_4,y_2 + 0x8515,0,0);
              x._3_1_ = (x._3_1_ & 1 & bVar7) != 0;
              _x_4 = _x_4->next;
              y_2 = y_2 + 1;
            }
          }
          else if (GStack_1c - 0x8c18 < 2) {
            iVar9 = _internalformat_local->next->x;
            it._4_4_ = 0;
            _y = _internalformat_local->next;
            if ((gl_local._7_1_ & 1) == 0) {
              iVar10 = djgt__count(_internalformat_local);
              (*p_Var1)(GVar6,0,GVar5,iVar9,iVar10,0,0x1903,0x1401,(void *)0x0);
            }
            else {
              iVar10 = djgt__mipcnt(iVar9,0,0);
              GVar5 = local_20;
              iVar11 = djgt__count(_internalformat_local);
              (*p_Var3)(GVar6,iVar10,GVar5,iVar9,iVar11);
            }
            while (_y != (djg_texture *)0x0) {
              _y = _y->next;
              bVar7 = djgt__glTexSubImage2D(_internalformat_local->next,GStack_1c,0,it._4_4_);
              x._3_1_ = (x._3_1_ & 1 & bVar7) != 0;
              it._4_4_ = it._4_4_ + 1;
            }
          }
          else {
            if (1 < GStack_1c - 0x8c1a) {
              fprintf(_stdout,"djg_error: Unsupported GL texture target\n");
              fflush(_stdout);
              return false;
            }
            iVar9 = _internalformat_local->next->x;
            iVar10 = _internalformat_local->next->y;
            iVar11 = djgt__count(_internalformat_local);
            GVar5 = GStack_1c;
            p_Var4 = glad_glTexStorage3D;
            _x_5 = _internalformat_local->next;
            if ((gl_local._7_1_ & 1) == 0) {
              (*glad_glTexImage3D)
                        (GStack_1c,0,local_20,iVar9,iVar10,iVar11,0,0x1903,0x1401,(void *)0x0);
            }
            else {
              iVar12 = djgt__mipcnt(iVar9,iVar10,0);
              (*p_Var4)(GVar5,iVar12,local_20,iVar9,iVar10,iVar11);
            }
            y_3 = 0;
            while( true ) {
              local_115 = 0;
              if (y_3 < iVar11) {
                local_115 = x._3_1_;
              }
              if ((local_115 & 1) == 0) break;
              bVar7 = djgt__glTexSubImage3D(_x_5,GStack_1c,0,0,y_3);
              x._3_1_ = (x._3_1_ & 1 & bVar7) != 0;
              _x_5 = _x_5->next;
              y_3 = y_3 + 1;
            }
          }
          goto LAB_00194057;
        }
      }
    }
    iVar9 = _internalformat_local->next->x;
    iVar10 = _internalformat_local->next->y;
    if ((gl_local._7_1_ & 1) == 0) {
      (*glad_glTexImage2D)(GStack_1c,0,local_20,iVar9,iVar10,0,0x1903,0x1401,(void *)0x0);
    }
    else {
      iVar11 = djgt__mipcnt(iVar9,iVar10,0);
      (*p_Var3)(GVar6,iVar11,local_20,iVar9,iVar10);
    }
    bVar7 = djgt__glTexSubImage2D(_internalformat_local->next,GStack_1c,0,0);
    x._3_1_ = (x._3_1_ & 1 & bVar7) != 0;
  }
LAB_00194057:
  if (((gl_local._6_1_ & 1) != 0) && ((x._3_1_ & 1) != 0)) {
    (*glad_glGenerateMipmap)(GStack_1c);
  }
  bVar7 = djgt__validate();
  x._3_1_ = (x._3_1_ & 1 & bVar7) != 0;
  if ((bool)x._3_1_) {
    GVar8 = (*glad_glIsTexture)(*_glt);
    if (GVar8 != '\0') {
      (*glad_glDeleteTextures)(1,_glt);
    }
    *_glt = x_1;
    texture_local._7_1_ = true;
  }
  else {
    fprintf(_stdout,"djg_error: Caught OpenGL error\n");
    fflush(_stdout);
    texture_local._7_1_ = false;
  }
  return texture_local._7_1_;
}

Assistant:

DJGDEF bool
djgt_to_gl(
    const djg_texture *texture,
    GLint target,
    GLint internalformat,
    bool immutable,
    bool mipmap,
    GLuint *gl
) {
    bool v = true;
    GLuint glt;

    DJG_ASSERT(texture && gl);
    djgt__validate(); // flush previous OpenGL errors

    if (!djgt__count(texture)) return false;
    glGenTextures(1, &glt);
    glBindTexture(target, glt);
    switch (target) {
        /*************************************************************/
        /***/
        /***/
        // 1D
        case GL_TEXTURE_1D:
        case GL_PROXY_TEXTURE_1D: {
            int x = texture->next->x;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage1D(target,
                               djgt__mipcnt(x, 0, 0),
                               internalformat,
                               x);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage1D(target,
                    /*level*/0,
                             internalformat,
                             x,
                   /*border*/0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            djgt__glTexSubImage1D(texture->next, target, /*xoffset*/0);
        } break;

        /*************************************************************/
        /***/
        /***/
        // 1D_ARRAY
        case GL_TEXTURE_1D_ARRAY:
        case GL_PROXY_TEXTURE_1D_ARRAY: {
            int x = texture->next->x;
            int i = 0;
            const djg_texture *it = texture->next;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage2D(target,
                               djgt__mipcnt(x, 0, 0),
                               internalformat,
                               x,
                               djgt__count(texture));
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage2D(target,
                    /*level*/0,
                             internalformat,
                             x,
                             djgt__count(texture),
                   /*border*/0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            while (it) {
                it = it->next;
                v&= djgt__glTexSubImage2D(texture->next,
                                          target,
                               /*offsets*/0, i);
                ++i;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // 2D
        case GL_TEXTURE_2D:
        case GL_TEXTURE_RECTANGLE:
        case GL_PROXY_TEXTURE_2D:
        case GL_PROXY_TEXTURE_RECTANGLE: {
            int x = texture->next->x;
            int y = texture->next->y;
#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage2D(target,
                               djgt__mipcnt(x, y, 0),
                               internalformat,
                               x,
                               y);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage2D(target,
                    /*level*/0,
                             internalformat,
                             x,
                             y,
                   /*border*/0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            v&= djgt__glTexSubImage2D(texture->next, target, /*offsets*/0, 0);
        } break;

        /*************************************************************/
        /***/
        /***/
        // CUBEMAP
        case GL_TEXTURE_CUBE_MAP: {
            int x = texture->next->x;
            int y = texture->next->y;
            const djg_texture *it = texture->next;
            int i;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage2D(target,
                               djgt__mipcnt(x, y, 0),
                               internalformat,
                               x,
                               y);
            } else
#endif // NGL_ARB_texture_storage
            {
                for (i = 0; i < 6; ++i)
                    glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i,
                                 0, internalformat, x, y, 0,
                        /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            for (i = 0; i < 6 && it && v; ++i) {
                v&= djgt__glTexSubImage2D(it,
                                          GL_TEXTURE_CUBE_MAP_POSITIVE_X + i,
                               /*offsets*/0, 0);
                it = it->next;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // 2D_ARRAY
        case GL_TEXTURE_2D_ARRAY:
        case GL_PROXY_TEXTURE_2D_ARRAY: {
            int x = texture->next->x;
            int y = texture->next->y;
            int z = djgt__count(texture);
            const djg_texture *it = texture->next;
            int i;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage3D(target,
                               djgt__mipcnt(x, y, 0),
                               internalformat,
                               x,
                               y,
                               z);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage3D(target, 0, internalformat, x, y, z, 0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            for (i = 0; i < z && v; ++i) {
                v&= djgt__glTexSubImage3D(it,
                                          target,
                               /*offsets*/0, 0, i);
                it = it->next;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // 3D
        case GL_TEXTURE_3D:
        case GL_PROXY_TEXTURE_3D: {
            int x = texture->next->x;
            int y = texture->next->y;
            int z = djgt__count(texture);
            const djg_texture *it = texture->next;
            int i;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage3D(target,
                               djgt__mipcnt(x, y, z),
                               internalformat,
                               x,
                               y,
                               z);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage3D(target, 0, internalformat, x, y, z, 0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            for (i = 0; i < z && v; ++i) {
                v&= djgt__glTexSubImage3D(it,
                                          target,
                               /*offsets*/0, 0, z);
                it = it->next;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // Error
        default:
            DJG_LOG("djg_error: Unsupported GL texture target\n");

            return false;
            break;
    }

    if (mipmap && v) glGenerateMipmap(target);

    if (!(v&= djgt__validate())) {
        DJG_LOG("djg_error: Caught OpenGL error\n");

        return false;
    }

    if (glIsTexture(*gl)) glDeleteTextures(1, gl);
    *gl = glt;

    return true;
}